

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
nuraft::raft_server::process_req(raft_server *this,req_msg *req,req_ext_params *ext_params)

{
  bool bVar1;
  __int_type_conflict _Var2;
  int iVar3;
  msg_type mVar4;
  int32 iVar5;
  uint uVar6;
  uint uVar7;
  element_type *peVar8;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *this_00;
  element_type *_ctx;
  element_type *peVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar14;
  req_msg *in_stack_00000048;
  raft_server *in_stack_00000050;
  Param local_res230;
  Param local_res258;
  bool term_updated;
  unique_lock<std::recursive_mutex> guard;
  CbReturnCode rc;
  Param param;
  ptr<resp_msg> *resp;
  req_msg *in_stack_00000808;
  raft_server *in_stack_00000810;
  Param *in_stack_fffffffffffffca8;
  unique_lock<std::recursive_mutex> *in_stack_fffffffffffffcb0;
  cb_func *in_stack_fffffffffffffcb8;
  msg_type *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  ulong in_stack_fffffffffffffcd0;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  req_msg *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  req_msg *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  int32_t iVar15;
  string local_1e8 [4];
  msg_type in_stack_fffffffffffffe1c;
  string local_1c8 [64];
  int32 local_188;
  undefined4 local_184;
  req_msg *in_stack_fffffffffffffe80;
  raft_server *in_stack_fffffffffffffe88;
  string local_168 [40];
  req_msg *in_stack_fffffffffffffec0;
  raft_server *in_stack_fffffffffffffec8;
  Param local_128;
  Param local_100;
  undefined1 local_e2;
  byte local_e1;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [36];
  ReturnCode local_3c;
  Param local_38;
  req_msg *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  
  iVar15 = *(int32_t *)(in_RSI + 0x38);
  local_18 = in_RDX;
  _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffffcb8);
  cb_func::Param::Param(&local_38,iVar15,_Var2,-1,(void *)0x0);
  local_38.ctx = local_18;
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d8141);
  local_3c = cb_func::call(in_stack_fffffffffffffcb8,
                           (Type)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                           in_stack_fffffffffffffca8);
  if (local_3c == ReturnNull) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar1) {
      peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d81a0);
      iVar3 = (*peVar8->_vptr_logger[7])();
      if (2 < iVar3) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d81c6);
        msg_if_given_abi_cxx11_((char *)local_60,"by callback, return null");
        (*peVar8->_vptr_logger[8])
                  (peVar8,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"process_req",0x28a,local_60);
        std::__cxx11::string::~string(local_60);
      }
    }
    std::shared_ptr<nuraft::resp_msg>::shared_ptr
              ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    _Var13._M_pi = extraout_RDX;
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar1) {
      peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d829c);
      iVar3 = (*peVar8->_vptr_logger[7])();
      if (4 < iVar3) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d82c2);
        msg_base::get_type(&local_18->super_msg_base);
        msg_type_to_string_abi_cxx11_(in_stack_fffffffffffffe1c);
        uVar10 = std::__cxx11::string::c_str();
        uVar6 = msg_base::get_src(&local_18->super_msg_base);
        uVar11 = req_msg::get_last_log_idx(local_18);
        uVar12 = req_msg::get_last_log_term(local_18);
        this_00 = req_msg::log_entries(local_18);
        in_stack_fffffffffffffca8 =
             (Param *)std::
                      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                      ::size(this_00);
        in_stack_fffffffffffffcb0 =
             (unique_lock<std::recursive_mutex> *)req_msg::get_commit_idx(local_18);
        in_stack_fffffffffffffcb8 = (cb_func *)msg_base::get_term(&local_18->super_msg_base);
        msg_if_given_abi_cxx11_
                  ((char *)local_90,
                   "Receive a %s message from %d with LastLogIndex=%lu, LastLogTerm %lu, EntriesLength=%zu, CommitIndex=%lu and Term=%lu"
                   ,uVar10,(ulong)uVar6,uVar11,uVar12);
        (*peVar8->_vptr_logger[8])
                  (peVar8,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"process_req",0x296,local_90);
        std::__cxx11::string::~string(local_90);
        std::__cxx11::string::~string(local_b0);
      }
    }
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffcb8);
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      if (bVar1) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d84e5);
        iVar3 = (*peVar8->_vptr_logger[7])();
        if (2 < iVar3) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d850b);
          msg_if_given_abi_cxx11_((char *)local_d0,"stopping, return null");
          (*peVar8->_vptr_logger[8])
                    (peVar8,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"process_req",0x29a,local_d0);
          std::__cxx11::string::~string(local_d0);
        }
      }
      std::shared_ptr<nuraft::resp_msg>::shared_ptr
                ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8
                );
      _Var13._M_pi = extraout_RDX_00;
    }
    else {
      mVar4 = msg_base::get_type(&local_18->super_msg_base);
      if (mVar4 == client_request) {
        pVar14 = handle_cli_req_prelock
                           ((raft_server *)
                            CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                            in_stack_fffffffffffffd40,
                            (req_ext_params *)
                            CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        _Var13 = pVar14.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
      }
      else {
        std::unique_lock<std::recursive_mutex>::unique_lock
                  (in_stack_fffffffffffffcb0,(mutex_type *)in_stack_fffffffffffffca8);
        mVar4 = msg_base::get_type(&local_18->super_msg_base);
        if (((mVar4 == append_entries_request) ||
            (mVar4 = msg_base::get_type(&local_18->super_msg_base), mVar4 == request_vote_request))
           || (mVar4 = msg_base::get_type(&local_18->super_msg_base),
              mVar4 == install_snapshot_request)) {
          msg_base::get_term(&local_18->super_msg_base);
          local_e1 = update_term((raft_server *)
                                 CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                                 in_stack_fffffffffffffcd0);
          if ((((*(byte *)(in_RSI + 0x148) & 1) == 0) &&
              (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffcb8)
              , !bVar1)) &&
             (((local_e1 & 1) != 0 &&
              (mVar4 = msg_base::get_type(&local_18->super_msg_base), mVar4 == request_vote_request)
              ))) {
            decay_target_priority
                      ((raft_server *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00))
            ;
          }
          if (0 < *(int *)(in_RSI + 0x14c)) {
            *(undefined4 *)(in_RSI + 0x14c) = 2;
          }
        }
        local_e2 = 0;
        std::shared_ptr<nuraft::resp_msg>::shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1d8771);
        mVar4 = msg_base::get_type(&local_18->super_msg_base);
        if (mVar4 == append_entries_request) {
          iVar15 = *(int32_t *)(in_RSI + 0x38);
          _Var2 = std::__atomic_base::operator_cast_to_int
                            ((__atomic_base<int> *)in_stack_fffffffffffffcb8);
          iVar5 = msg_base::get_src(&local_18->super_msg_base);
          cb_func::Param::Param(&local_100,iVar15,_Var2,iVar5,local_18);
          std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                    ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d880f)
          ;
          cb_func::call(in_stack_fffffffffffffcb8,(Type)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                        in_stack_fffffffffffffca8);
          handle_append_entries(in_stack_00000810,in_stack_00000808);
          std::shared_ptr<nuraft::resp_msg>::operator=
                    ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffcb0,
                     (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffca8);
          std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1d8873);
          iVar15 = *(int32_t *)(in_RSI + 0x38);
          _Var2 = std::__atomic_base::operator_cast_to_int
                            ((__atomic_base<int> *)in_stack_fffffffffffffcb8);
          iVar5 = msg_base::get_src(&local_18->super_msg_base);
          _ctx = std::__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
          cb_func::Param::Param(&local_128,iVar15,_Var2,iVar5,_ctx);
          std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                    ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d88f3)
          ;
          cb_func::call(in_stack_fffffffffffffcb8,(Type)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                        in_stack_fffffffffffffca8);
        }
        else {
          mVar4 = msg_base::get_type(&local_18->super_msg_base);
          if (mVar4 == request_vote_request) {
            handle_vote_req(in_stack_00000050,in_stack_00000048);
            std::shared_ptr<nuraft::resp_msg>::operator=
                      ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffcb0,
                       (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffca8);
            std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1d898f)
            ;
          }
          else {
            mVar4 = msg_base::get_type(&local_18->super_msg_base);
            if (mVar4 == pre_vote_request) {
              handle_prevote_req(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
              std::shared_ptr<nuraft::resp_msg>::operator=
                        ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffcb0,
                         (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffca8);
              std::shared_ptr<nuraft::resp_msg>::~shared_ptr
                        ((shared_ptr<nuraft::resp_msg> *)0x1d89f7);
            }
            else {
              mVar4 = msg_base::get_type(&local_18->super_msg_base);
              if (mVar4 == ping_request) {
                bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
                if (bVar1) {
                  peVar8 = std::
                           __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x1d8a53);
                  iVar3 = (*peVar8->_vptr_logger[7])();
                  if (3 < iVar3) {
                    peVar8 = std::
                             __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x1d8a8c);
                    uVar6 = msg_base::get_src(&local_18->super_msg_base);
                    msg_if_given_abi_cxx11_((char *)local_168,"got ping from %d",(ulong)uVar6);
                    (*peVar8->_vptr_logger[8])
                              (peVar8,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                               ,"process_req",0x2cf,local_168);
                    std::__cxx11::string::~string(local_168);
                  }
                }
                std::
                __shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d8b40);
                srv_state::get_term((srv_state *)0x1d8b48);
                local_184 = 0x13;
                local_188 = msg_base::get_src(&local_18->super_msg_base);
                cs_new<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int>
                          ((unsigned_long *)
                           CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                           in_stack_fffffffffffffcc0,(int *)in_stack_fffffffffffffcb8,
                           (int *)in_stack_fffffffffffffcb0);
                std::shared_ptr<nuraft::resp_msg>::operator=
                          ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffcb0,
                           (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffca8);
                std::shared_ptr<nuraft::resp_msg>::~shared_ptr
                          ((shared_ptr<nuraft::resp_msg> *)0x1d8be4);
              }
              else {
                mVar4 = msg_base::get_type(&local_18->super_msg_base);
                if (mVar4 == priority_change_request) {
                  handle_priority_change_req(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
                  std::shared_ptr<nuraft::resp_msg>::operator=
                            ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffcb0,
                             (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffca8);
                  std::shared_ptr<nuraft::resp_msg>::~shared_ptr
                            ((shared_ptr<nuraft::resp_msg> *)0x1d8c46);
                }
                else {
                  handle_ext_msg((raft_server *)
                                 CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                 in_stack_fffffffffffffd20);
                  std::shared_ptr<nuraft::resp_msg>::operator=
                            ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffcb0,
                             (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffca8);
                  std::shared_ptr<nuraft::resp_msg>::~shared_ptr
                            ((shared_ptr<nuraft::resp_msg> *)0x1d8c89);
                }
              }
            }
          }
        }
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
        if ((bVar1) &&
           (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318)),
           bVar1)) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d8cd8);
          iVar3 = (*peVar8->_vptr_logger[7])();
          if (4 < iVar3) {
            peVar8 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1d8d0b);
            peVar9 = std::
                     __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1d8d1d);
            msg_base::get_type(&peVar9->super_msg_base);
            msg_type_to_string_abi_cxx11_(in_stack_fffffffffffffe1c);
            uVar10 = std::__cxx11::string::c_str();
            peVar9 = std::
                     __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1d8d5d);
            uVar6 = msg_base::get_dst(&peVar9->super_msg_base);
            peVar9 = std::
                     __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1d8d78);
            bVar1 = resp_msg::get_accepted(peVar9);
            uVar7 = (uint)bVar1;
            peVar9 = std::
                     __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1d8da1);
            uVar11 = msg_base::get_term(&peVar9->super_msg_base);
            peVar9 = std::
                     __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1d8dbd);
            uVar12 = resp_msg::get_next_idx(peVar9);
            msg_if_given_abi_cxx11_
                      ((char *)local_1c8,
                       "Response back a %s message to %d with Accepted=%d, Term=%lu, NextIndex=%lu",
                       uVar10,(ulong)uVar6,(ulong)uVar7,uVar11,uVar12);
            (*peVar8->_vptr_logger[8])
                      (peVar8,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"process_req",0x2e4,local_1c8);
            std::__cxx11::string::~string(local_1c8);
            std::__cxx11::string::~string(local_1e8);
          }
        }
        local_e2 = 1;
        std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_fffffffffffffcb0);
        _Var13._M_pi = extraout_RDX_01;
      }
    }
  }
  pVar14.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  pVar14.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar14.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::process_req(req_msg& req,
                                       const req_ext_params& ext_params) {
    cb_func::Param param(id_, leader_);
    param.ctx = &req;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::ProcessReq, &param);
    if (rc == CbReturnCode::ReturnNull) {
        p_wn("by callback, return null");
        return nullptr;
    }

    p_db( "Receive a %s message from %d with LastLogIndex=%" PRIu64 ", "
          "LastLogTerm %" PRIu64 ", EntriesLength=%zu, CommitIndex=%" PRIu64 " and Term=%" PRIu64 "",
          msg_type_to_string(req.get_type()).c_str(),
          req.get_src(),
          req.get_last_log_idx(),
          req.get_last_log_term(),
          req.log_entries().size(),
          req.get_commit_idx(),
          req.get_term() );

    if (stopping_) {
        // Shutting down, ignore all incoming messages.
        p_wn("stopping, return null");
        return nullptr;
    }

    if ( req.get_type() == msg_type::client_request ) {
        // Client request doesn't need to go through below process.
        return handle_cli_req_prelock(req, ext_params);
    }

    recur_lock(lock_);
    if ( req.get_type() == msg_type::append_entries_request ||
         req.get_type() == msg_type::request_vote_request ||
         req.get_type() == msg_type::install_snapshot_request ) {
        // we allow the server to be continue after term updated to save a round message
        bool term_updated = update_term(req.get_term());

        if ( !im_learner_ &&
             !hb_alive_ &&
             term_updated &&
             req.get_type() == msg_type::request_vote_request ) {
            // If someone has newer term, that means leader has not been
            // elected in the current term, and this node's election timer
            // has been reset by this request.
            // We should decay the target priority here.
            decay_target_priority();
        }

        // Reset stepping down value to prevent this server goes down when leader
        // crashes after sending a LeaveClusterRequest
        if (steps_to_down_ > 0) {
            steps_to_down_ = 2;
        }
    }

    ptr<resp_msg> resp;
    if (req.get_type() == msg_type::append_entries_request) {
        {
            cb_func::Param param(id_, leader_, req.get_src(), &req);
            ctx_->cb_func_.call(cb_func::ReceivedAppendEntriesReq, &param);
        }
        resp = handle_append_entries(req);
        {
            cb_func::Param param(id_, leader_, req.get_src(), resp.get());
            ctx_->cb_func_.call(cb_func::SentAppendEntriesResp, &param);
        }

    } else if (req.get_type() == msg_type::request_vote_request) {
        resp = handle_vote_req(req);

    } else if (req.get_type() == msg_type::pre_vote_request) {
        resp = handle_prevote_req(req);

    } else if (req.get_type() == msg_type::ping_request) {
        p_in("got ping from %d", req.get_src());
        resp = cs_new<resp_msg>( state_->get_term(),
                                 msg_type::ping_response,
                                 id_,
                                 req.get_src() );

    } else if (req.get_type() == msg_type::priority_change_request) {
        resp = handle_priority_change_req(req);

    } else {
        // extended requests
        resp = handle_ext_msg(req);
    }

    if (resp) {
        p_db( "Response back a %s message to %d with Accepted=%d, "
              "Term=%" PRIu64 ", NextIndex=%" PRIu64 "",
              msg_type_to_string(resp->get_type()).c_str(),
              resp->get_dst(),
              resp->get_accepted() ? 1 : 0,
              resp->get_term(),
              resp->get_next_idx() );
    }

    return resp;
}